

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

int __thiscall google::protobuf::EnumOptions::ByteSize(EnumOptions *this)

{
  bool bVar1;
  int iVar2;
  UninterpretedOption *value;
  UnknownFieldSet *pUVar3;
  int local_18;
  int local_14;
  int i;
  int total_size;
  EnumOptions *this_local;
  
  local_14 = 0;
  if (((this->_has_bits_[0] & 0xff) != 0) && (bVar1 = has_allow_alias(this), bVar1)) {
    local_14 = 2;
  }
  iVar2 = uninterpreted_option_size(this);
  local_14 = iVar2 * 2 + local_14;
  for (local_18 = 0; iVar2 = uninterpreted_option_size(this), local_18 < iVar2;
      local_18 = local_18 + 1) {
    value = uninterpreted_option(this,local_18);
    iVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::UninterpretedOption>
                      (value);
    local_14 = iVar2 + local_14;
  }
  iVar2 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  local_14 = iVar2 + local_14;
  pUVar3 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar3);
  if (!bVar1) {
    pUVar3 = unknown_fields(this);
    iVar2 = internal::WireFormat::ComputeUnknownFieldsSize(pUVar3);
    local_14 = iVar2 + local_14;
  }
  this->_cached_size_ = local_14;
  return local_14;
}

Assistant:

int EnumOptions::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional bool allow_alias = 2 [default = true];
    if (has_allow_alias()) {
      total_size += 1 + 1;
    }

  }
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2 * this->uninterpreted_option_size();
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->uninterpreted_option(i));
  }

  total_size += _extensions_.ByteSize();

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}